

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

void __thiscall pbrt::ThreadPool::ThreadPool(ThreadPool *this,int nThreads)

{
  int in_ESI;
  ThreadPool **in_RDI;
  long *in_FS_OFFSET;
  int i;
  value_type *__x;
  condition_variable *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  int local_10;
  
  *in_RDI = (ThreadPool *)0x0;
  std::mutex::mutex((mutex *)0x8dd747);
  this_00 = (condition_variable *)(in_RDI + 6);
  std::condition_variable::condition_variable(this_00);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x8dd76d);
  *(undefined1 *)(in_RDI + 0xf) = 0;
  *(undefined4 *)(*in_FS_OFFSET + -0x130) = 0;
  for (local_10 = 0; local_10 < in_ESI + -1; local_10 = local_10 + 1) {
    __x = (value_type *)(in_RDI + 0xc);
    std::thread::thread<void(pbrt::ThreadPool::*)(int),pbrt::ThreadPool*,int,void>
              ((thread *)0x0,(type *)workerFunc,in_RDI,
               (int *)CONCAT44(local_10 + 1,in_stack_ffffffffffffffc8));
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)this_00,__x);
    std::thread::~thread((thread *)0x8dd810);
  }
  return;
}

Assistant:

ThreadPool::ThreadPool(int nThreads) {
    ThreadIndex = 0;

    // Launch one fewer worker thread than the total number we want doing
    // work, since the main thread helps out, too.
    for (int i = 0; i < nThreads - 1; ++i)
        threads.push_back(std::thread(&ThreadPool::workerFunc, this, i + 1));
}